

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerFactory.cpp
# Opt level: O0

void helics::BrokerFactory::abortAllBrokers(int errorCode,string_view errorString)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  undefined4 in_EDI;
  shared_ptr<helics::Broker> *brk;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
  *__range2;
  vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_> brokers
  ;
  undefined1 in_stack_00000120 [16];
  undefined1 in_stack_00000130 [16];
  vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
  *in_stack_fffffffffffffeb8;
  milliseconds in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 uVar4;
  vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
  *in_stack_fffffffffffffed0;
  int local_124;
  duration<long,std::ratio<1l,1000l>> local_120 [24];
  char *local_108;
  undefined8 local_100;
  undefined1 local_f8 [32];
  __sv_type local_d8;
  reference local_c8;
  shared_ptr<helics::Broker> *local_c0;
  __normal_iterator<std::shared_ptr<helics::Broker>_*,_std::vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>_>
  local_b8;
  undefined1 *local_b0;
  undefined1 local_a8 [28];
  undefined4 local_8c;
  undefined1 local_88 [16];
  undefined1 local_78 [32];
  undefined8 local_58;
  undefined1 *local_50;
  char *local_48;
  undefined8 uStack_40;
  undefined1 *local_38;
  vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
  *local_30;
  char *local_28;
  undefined8 uStack_20;
  undefined1 *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  local_8c = in_EDI;
  getAllBrokers();
  local_b0 = local_a8;
  local_b8._M_current =
       (shared_ptr<helics::Broker> *)
       CLI::std::
       vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>::
       begin(in_stack_fffffffffffffeb8);
  local_c0 = (shared_ptr<helics::Broker> *)
             CLI::std::
             vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
             ::end(in_stack_fffffffffffffeb8);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<std::shared_ptr<helics::Broker>_*,_std::vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>_>
                      ((__normal_iterator<std::shared_ptr<helics::Broker>_*,_std::vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>_>
                        *)in_stack_fffffffffffffec0.__r,
                       (__normal_iterator<std::shared_ptr<helics::Broker>_*,_std::vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>_>
                        *)in_stack_fffffffffffffeb8);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_c8 = __gnu_cxx::
               __normal_iterator<std::shared_ptr<helics::Broker>_*,_std::vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>_>
               ::operator*(&local_b8);
    in_stack_fffffffffffffec0.__r =
         (rep)CLI::std::
              __shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x4f8257);
    local_108 = "{} sent abort message: \'{}\'";
    local_100 = 0x1b;
    uVar4 = local_8c;
    peVar3 = CLI::std::__shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x4f8289);
    iVar2 = (*peVar3->_vptr_Broker[0xb])();
    in_stack_fffffffffffffed0 =
         (vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
          *)CONCAT44(extraout_var,iVar2);
    local_18 = local_f8;
    local_28 = local_108;
    uStack_20 = local_100;
    local_38 = local_88;
    local_48 = local_108;
    uStack_40 = local_100;
    local_30 = in_stack_fffffffffffffed0;
    ::fmt::v11::detail::value<fmt::v11::context>::
    value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
              ((value<fmt::v11::context> *)in_stack_fffffffffffffed0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(uVar4,in_stack_fffffffffffffec8));
    ::fmt::v11::detail::value<fmt::v11::context>::
    value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
              ((value<fmt::v11::context> *)in_stack_fffffffffffffed0,
               (basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(uVar4,in_stack_fffffffffffffec8));
    local_8 = &local_58;
    local_10 = local_78;
    local_58 = 0xdd;
    local_50 = local_10;
    ::fmt::v11::vformat_abi_cxx11_((string_view)in_stack_00000130,(format_args)in_stack_00000120);
    local_d8 = std::__cxx11::string::operator_cast_to_basic_string_view
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffec0.__r);
    (**(code **)((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  in_stack_fffffffffffffec0.__r)->_M_dataplus)._M_p + 0xe0))
              (in_stack_fffffffffffffec0.__r,uVar4,local_d8._M_len,local_d8._M_str);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffec0.__r);
    peVar3 = CLI::std::__shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x4f83d3);
    (*peVar3->_vptr_Broker[3])();
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<helics::Broker>_*,_std::vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>_>
    ::operator++(&local_b8);
  }
  local_124 = 0xfa;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_120,&local_124);
  cleanUpBrokers(in_stack_fffffffffffffec0);
  CLI::std::
  vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>::
  ~vector(in_stack_fffffffffffffed0);
  return;
}

Assistant:

void abortAllBrokers(int errorCode, std::string_view errorString)
{
    auto brokers = getAllBrokers();
    for (auto& brk : brokers) {
        brk->globalError(errorCode,
                         fmt::format("{} sent abort message: '{}'",
                                     brk->getIdentifier(),
                                     errorString));

        brk->disconnect();
    }
    cleanUpBrokers(std::chrono::milliseconds(250));
}